

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

uint32_t cfd::core::Serializer::GetVariableIntSize(uint64_t value)

{
  unsigned_short uVar1;
  uint uVar2;
  uint64_t value_local;
  
  if (value < 0xfd) {
    value_local._4_4_ = 1;
  }
  else {
    uVar1 = ::std::numeric_limits<unsigned_short>::max();
    if (uVar1 < value) {
      uVar2 = ::std::numeric_limits<unsigned_int>::max();
      if (uVar2 < value) {
        value_local._4_4_ = 9;
      }
      else {
        value_local._4_4_ = 5;
      }
    }
    else {
      value_local._4_4_ = 3;
    }
  }
  return value_local._4_4_;
}

Assistant:

uint32_t Serializer::GetVariableIntSize(uint64_t value) {
  if (value <= kViMax8)
    return 1;
  else if (value <= std::numeric_limits<uint16_t>::max())
    return 3;
  else if (value <= std::numeric_limits<uint32_t>::max())
    return 5;
  else
    return 9;
}